

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall Heap::sort_up(Heap *this,GridNode *item)

{
  GridNode *item_00;
  int iVar1;
  GridNode *parent;
  int parentIndex;
  GridNode *item_local;
  Heap *this_local;
  
  parent._4_4_ = clamp((item->index + -1) / 2,0,this->maxCount + -1);
  while( true ) {
    item_00 = this->list[parent._4_4_];
    iVar1 = GridNode::compare_item(item,item_00);
    if (iVar1 < 1) break;
    swap_items(this,item,item_00);
    parent._4_4_ = clamp((item->index + -1) / 2,0,this->maxCount + -1);
  }
  return;
}

Assistant:

void sort_up(GridNode *item)
    {
        int parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        while (true)
        {
            GridNode *parent = list[parentIndex];
            if (item->compare_item(parent) > 0)
            {
                swap_items(item, parent);
            }
            else
            {
                break;
            }
            parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        }
    }